

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O2

void __thiscall
sznet::net::SelectPoller::fillActiveChannels
          (SelectPoller *this,int numEvents,ChannelList *activeChannels)

{
  ulong uVar1;
  int iVar2;
  const_iterator cVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  pointer __k;
  bool bVar6;
  value_type local_48;
  Channel *channel;
  ChannelList *local_38;
  
  __k = (this->m_pollfds).
        super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
        ._M_impl.super__Vector_impl_data._M_start;
  channel = (Channel *)&(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
  local_38 = activeChannels;
  do {
    if ((__k == (this->m_pollfds).
                super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                ._M_impl.super__Vector_impl_data._M_finish) || (numEvents < 1)) {
      return;
    }
    iVar2 = __k->fd / 0x40;
    uVar1 = (long)__k->fd % 0x40;
    bVar6 = ((ulong)(this->m_rfds).fds_bits[iVar2] >> (uVar1 & 0x3f) & 1) != 0;
    uVar4 = bVar6 + 8;
    if (((ulong)(this->m_wfds).fds_bits[iVar2] >> (uVar1 & 0x3f) & 1) == 0) {
      uVar4 = (uint)bVar6;
    }
    uVar5 = uVar4 + 0x10;
    if (((ulong)(this->m_efds).fds_bits[iVar2] >> (uVar1 & 0x3f) & 1) == 0) {
      uVar5 = uVar4;
    }
    if (uVar5 != 0) {
      cVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
              ::find(&(this->super_Poller).m_channels._M_t,&__k->fd);
      if ((Channel *)cVar3._M_node == channel) {
        __assertion = "ch != m_channels.end()";
        uVar4 = 100;
LAB_0011851e:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,uVar4,
                      "void sznet::net::SelectPoller::fillActiveChannels(int, ChannelList *) const")
        ;
      }
      local_48 = (value_type)cVar3._M_node[1]._M_parent;
      if (local_48->m_fd != __k->fd) {
        __assertion = "channel->fd() == it->fd";
        uVar4 = 0x66;
        goto LAB_0011851e;
      }
      numEvents = numEvents + -1;
      local_48->m_revents = uVar5;
      std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::push_back
                (local_38,&local_48);
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

void SelectPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const
{
	for (auto it = m_pollfds.begin(); it != m_pollfds.end() && numEvents > 0; ++it)
	{
		unsigned int revents = 0;
		if (FD_ISSET(it->fd, &m_rfds))
		{
			revents |= Channel::kReadEvent;
		}
		if (FD_ISSET(it->fd, &m_wfds))
		{
			revents |= Channel::kWriteEvent;
		}
		if (FD_ISSET(it->fd, &m_efds))
		{
			revents |= Channel::kErrorEvent;
		}
		if (revents > 0)
		{
			--numEvents;
			ChannelMap::const_iterator ch = m_channels.find(it->fd);
			assert(ch != m_channels.end());
			Channel* channel = ch->second;
			assert(channel->fd() == it->fd);
			channel->set_revents(revents);
			activeChannels->push_back(channel);
		}
	}
}